

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::AddNotDefinedError(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation,std::basic_string_view<char,std::char_traits<char>>)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  long lVar1;
  undefined8 *puVar2;
  char (*in_stack_fffffffffffffed8) [53];
  AlphaNum local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  string_view local_60 [3];
  
  lVar1 = *(long *)this;
  local_60[0] = NullSafeStringView("\"");
  local_90.piece_._M_str = *(char **)(lVar1 + 0x130);
  local_90.piece_._M_len = *(size_t *)(lVar1 + 0x138);
  local_c0.piece_ = NullSafeStringView("\" seems to be defined in \"");
  puVar2 = *(undefined8 **)(*(long *)(lVar1 + 0x128) + 8);
  local_f0.piece_._M_str = (char *)*puVar2;
  local_f0.piece_._M_len = puVar2[1];
  local_120.piece_ = NullSafeStringView("\", which is not imported by \"");
  StrCat<std::__cxx11::string,char[53]>
            (__return_storage_ptr__,(lts_20250127 *)local_60,&local_90,&local_c0,&local_f0,
             &local_120,(AlphaNum *)(lVar1 + 0x98),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             "\".  To use it here, please add the necessary import.",in_stack_fffffffffffffed8);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}